

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O0

ByteString * __thiscall ByteString::operator^=(ByteString *this,ByteString *rhs)

{
  byte bVar1;
  unsigned_long *puVar2;
  uchar *puVar3;
  byte *pbVar4;
  ByteString *in_RDI;
  size_t i;
  size_t xorLen;
  ByteString *in_stack_ffffffffffffffb8;
  size_type local_30;
  size_t local_28;
  size_t local_20;
  ulong local_18;
  
  local_20 = size((ByteString *)0x1c4acd);
  local_28 = size((ByteString *)0x1c4adc);
  puVar2 = std::min<unsigned_long>(&local_20,&local_28);
  local_18 = *puVar2;
  for (local_30 = 0; local_30 < local_18; local_30 = local_30 + 1) {
    puVar3 = const_byte_str(in_stack_ffffffffffffffb8);
    bVar1 = puVar3[local_30];
    pbVar4 = std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::operator[]
                       (&in_RDI->byteString,local_30);
    *pbVar4 = *pbVar4 ^ bVar1;
  }
  return in_RDI;
}

Assistant:

ByteString& ByteString::operator^=(const ByteString& rhs)
{
	size_t xorLen = std::min(this->size(), rhs.size());

	for (size_t i = 0; i < xorLen; i++)
	{
		byteString[i] ^= rhs.const_byte_str()[i];
	}

	return *this;
}